

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brng.c
# Opt level: O2

void brngCTRStepR(void *buf,size_t count,void *state)

{
  size_t *psVar1;
  void *dest;
  octet *dest_00;
  octet *hash;
  ulong count_00;
  size_t sVar2;
  size_t sVar3;
  void *buf_00;
  size_t count_01;
  
  psVar1 = (size_t *)((long)state + 0x60);
  count_00 = *(ulong *)((long)state + 0x60);
  if (count_00 != 0) {
    if (count <= count_00) {
      memCopy(buf,(void *)((long)psVar1 - count_00),count);
      count_01 = *psVar1 - count;
      goto LAB_001392fd;
    }
    memCopy(buf,(void *)((long)psVar1 - count_00),count_00);
    count = count - *psVar1;
    buf = (void *)((long)buf + *psVar1);
    *psVar1 = 0;
  }
  dest = (void *)((long)state + 0x68);
  dest_00 = (octet *)((long)state + 0x20);
  buf_00 = (void *)(count + 0x40 + (long)state);
  for (; 0x1f < count; count = count - 0x20) {
    sVar2 = beltHash_keep();
    sVar3 = beltHash_keep();
    memCopy(dest,(void *)(sVar2 + (long)dest),sVar3);
    beltHashStepH(state,0x20,dest);
    beltHashStepH(buf,0x20,dest);
    beltHashStepH(dest_00,0x20,dest);
    beltHashStepG((octet *)buf,dest);
    brngBlockInc((octet *)state);
    brngBlockXor2(dest_00,(octet *)buf);
    buf = (void *)((long)buf + 0x20);
    buf_00 = (void *)((long)buf_00 + -0x20);
  }
  if (count == 0) {
    return;
  }
  hash = (octet *)((long)state + 0x40);
  count_01 = 0x20 - count;
  memSet(buf_00,'\0',count_01);
  sVar2 = beltHash_keep();
  sVar3 = beltHash_keep();
  memCopy(dest,(void *)(sVar2 + (long)dest),sVar3);
  beltHashStepH(state,0x20,dest);
  beltHashStepH(buf,count,dest);
  beltHashStepH(buf_00,count_01,dest);
  beltHashStepH(dest_00,0x20,dest);
  beltHashStepG(hash,dest);
  memCopy(buf,hash,count);
  brngBlockInc((octet *)state);
  brngBlockXor2(dest_00,hash);
LAB_001392fd:
  *psVar1 = count_01;
  return;
}

Assistant:

void brngCTRStepR(void* buf, size_t count, void* state)
{
	brng_ctr_st* s = (brng_ctr_st*)state;
	ASSERT(memIsDisjoint2(buf, count, s, brngCTR_keep()));
	// есть резерв данных?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->block + 32 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->block + 32 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 32)
	{
		// Y_t <- belt-hash(key || s || X_t || r)
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, 32, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(buf, s->state_ex);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, buf);
		buf = (octet*)buf + 32;
		count -= 32;
	}
	// неполный блок?
	if (count)
	{
		// block <- beltHash(key || s || zero_pad(X_t) || r)
		memSetZero(s->block + count, 32 - count);
		memCopy(s->state_ex, s->state_ex + beltHash_keep(), beltHash_keep());
		beltHashStepH(s->s, 32, s->state_ex);
		beltHashStepH(buf, count, s->state_ex);
		beltHashStepH(s->block + count, 32 - count, s->state_ex);
		beltHashStepH(s->r, 32, s->state_ex);
		beltHashStepG(s->block, s->state_ex);
		// Y_t <- left(block)
		memCopy(buf, s->block, count);
		// next
		brngBlockInc(s->s);
		brngBlockXor2(s->r, s->block);
		s->reserved = 32 - count;
	}
}